

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateF32Vec
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,uint32_t num_components,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag)

{
  uint32_t local_3c;
  spv_result_t error;
  uint32_t underlying_type;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *diag_local;
  Instruction *pIStack_28;
  uint32_t num_components_local;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  local_3c = 0;
  _error = diag;
  diag_local._4_4_ = num_components;
  pIStack_28 = inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  this_local._4_4_ = GetUnderlyingType(this->_,decoration,inst,&local_3c);
  if (this_local._4_4_ == SPV_SUCCESS) {
    this_local._4_4_ =
         ValidateF32VecHelper
                   (this,(Decoration *)inst_local,pIStack_28,diag_local._4_4_,_error,local_3c);
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateF32Vec(
    const Decoration& decoration, const Instruction& inst,
    uint32_t num_components,
    const std::function<spv_result_t(const std::string& message)>& diag) {
  uint32_t underlying_type = 0;
  if (spv_result_t error =
          GetUnderlyingType(_, decoration, inst, &underlying_type)) {
    return error;
  }

  return ValidateF32VecHelper(decoration, inst, num_components, diag,
                              underlying_type);
}